

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)

{
  LocalRootParameterType LVar1;
  pointer puVar2;
  pointer pLVar3;
  CFGNode *pCVar4;
  dxil_spv_converter pdVar5;
  bool bVar6;
  uint32_t uVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  String *__str;
  unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_> *opt;
  pointer puVar10;
  pointer pLVar11;
  dxil_spv_result dVar12;
  pointer pFVar13;
  Converter dxil_converter;
  SPIRVModule module;
  uint32_t driver_version;
  uint32_t driver_id;
  ConvertedFunction entry_point;
  char buffer [4096];
  Converter local_10a0;
  SPIRVModule local_1098;
  uint32_t local_1090;
  uint32_t local_108c;
  dxil_spv_converter local_1088;
  ConvertedFunction local_1080;
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  local_1050;
  undefined1 local_1038 [16];
  undefined1 auStack_1028 [152];
  _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_f90;
  pointer local_f58;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f40 [68];
  
  dxil_spv::SPIRVModule::SPIRVModule(&local_1098);
  dxil_spv::Converter::Converter
            (&local_10a0,converter->bc_parser,converter->bc_reflection_parser,&local_1098);
  if ((converter->entry_point)._M_string_length != 0) {
    dxil_spv::Converter::set_entry_point(&local_10a0,(converter->entry_point)._M_dataplus._M_p);
  }
  dxil_spv::Converter::set_resource_remapping_interface
            (&local_10a0,&(converter->remapper).super_ResourceRemappingInterface);
  puVar10 = (converter->options).
            super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (converter->options).
           super__Vector_base<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar2) {
    do {
      dxil_spv::Converter::add_option
                (&local_10a0,
                 (puVar10->_M_t).
                 super___uniq_ptr_impl<dxil_spv::OptionBase,_std::default_delete<dxil_spv::OptionBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dxil_spv::OptionBase_*,_std::default_delete<dxil_spv::OptionBase>_>
                 .super__Head_base<0UL,_dxil_spv::OptionBase_*,_false>._M_head_impl);
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  pLVar11 = (converter->local_root_parameters).
            super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (converter->local_root_parameters).
           super__Vector_base<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar11 != pLVar3) {
    do {
      LVar1 = pLVar11->type;
      if (LVar1 == Table) {
        std::
        vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
        ::vector(&local_1050,&pLVar11->table_entries);
        dxil_spv::Converter::add_local_root_descriptor_table(&local_10a0,&local_1050);
        if (local_1050.
            super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          dxil_spv::free_in_thread
                    (local_1050.
                     super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else if (LVar1 == Descriptor) {
        dxil_spv::Converter::add_local_root_descriptor
                  (&local_10a0,(pLVar11->local_descriptor).resource_class,
                   (pLVar11->local_descriptor).register_space,
                   (pLVar11->local_descriptor).register_index);
      }
      else if (LVar1 == Constants) {
        dxil_spv::Converter::add_local_root_constants
                  (&local_10a0,(pLVar11->local_constants).register_space,
                   (pLVar11->local_constants).register_index,(pLVar11->local_constants).num_words);
      }
      pLVar11 = pLVar11 + 1;
    } while (pLVar11 != pLVar3);
  }
  dxil_spv::Converter::convert_entry_point(&local_1080,&local_10a0);
  if (local_1080.entry.entry == (CFGNode *)0x0) {
    p_Var8 = dxil_spv::get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      dxil_spv_converter_run_cold_3();
    }
    else {
      auStack_1028._0_4_ = 0x75662074;
      auStack_1028[4] = 'n';
      auStack_1028._5_6_ = 0x2e6e6f697463;
      auStack_1028[0xb] = '\n';
      auStack_1028[0xc] = '\0';
      local_1038[8] = 'o';
      local_1038[9] = ' ';
      local_1038[10] = 'c';
      local_1038[0xb] = 'o';
      local_1038[0xc] = 'n';
      local_1038[0xd] = 'v';
      local_1038[0xe] = 'e';
      local_1038[0xf] = 'r';
LAB_0010c0b4:
      local_1038._0_8_ = (CFGNode *)0x742064656c696146;
      pvVar9 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var8)(pvVar9,Error,local_1038);
    }
  }
  else {
    dxil_spv::CFGStructurizer::CFGStructurizer
              ((CFGStructurizer *)local_1038,local_1080.entry.entry,
               (CFGNodePool *)
               local_1080.node_pool._M_t.
               super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
               .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&local_1098);
    bVar6 = dxil_spv::Converter::get_driver_version(&local_10a0,&local_108c,&local_1090);
    if (bVar6) {
      dxil_spv::CFGStructurizer::set_driver_version
                ((CFGStructurizer *)local_1038,local_108c,local_1090);
    }
    dxil_spv::SPIRVModule::set_entry_build_point(&local_1098,local_1080.entry.func);
    dxil_spv::CFGStructurizer::run((CFGStructurizer *)local_1038);
    dxil_spv::SPIRVModule::emit_entry_point_function_body(&local_1098,(CFGStructurizer *)local_1038)
    ;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(local_f40);
    if (local_f58 != (pointer)0x0) {
      dxil_spv::free_in_thread(local_f58);
    }
    std::
    _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_f90);
    std::
    _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)(auStack_1028 + 0x60));
    if ((pointer)auStack_1028._64_8_ != (pointer)0x0) {
      dxil_spv::free_in_thread((void *)auStack_1028._64_8_);
    }
    local_1088 = converter;
    if ((pointer)auStack_1028._40_8_ != (pointer)0x0) {
      dxil_spv::free_in_thread((void *)auStack_1028._40_8_);
    }
    if ((pointer)auStack_1028._16_8_ != (pointer)0x0) {
      dxil_spv::free_in_thread((void *)auStack_1028._16_8_);
    }
    if (local_1080.leaf_functions.
        super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1080.leaf_functions.
        super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pFVar13 = local_1080.leaf_functions.
                super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pCVar4 = pFVar13->entry;
        if (pCVar4 == (CFGNode *)0x0) {
          p_Var8 = dxil_spv::get_thread_log_callback();
          if (p_Var8 == (LoggingCallback)0x0) {
            dxil_spv_converter_run_cold_1();
          }
          else {
            auStack_1028._0_4_ = 0x6c756e20;
            auStack_1028[4] = 'l';
            auStack_1028._5_6_ = 0xa21727470;
            local_1038[0] = 'L';
            local_1038[1] = 'e';
            local_1038[2] = 'a';
            local_1038[3] = 'f';
            local_1038[4] = ' ';
            local_1038[5] = 'f';
            local_1038[6] = 'u';
            local_1038[7] = 'n';
            local_1038[8] = 'c';
            local_1038[9] = 't';
            local_1038[10] = 'i';
            local_1038[0xb] = 'o';
            local_1038[0xc] = 'n';
            local_1038[0xd] = ' ';
            local_1038[0xe] = 'i';
            local_1038[0xf] = 's';
            pvVar9 = dxil_spv::get_thread_log_callback_userdata();
            (*p_Var8)(pvVar9,Error,(char *)local_1038);
          }
        }
        else {
          dxil_spv::CFGStructurizer::CFGStructurizer
                    ((CFGStructurizer *)local_1038,pFVar13->entry,
                     (CFGNodePool *)
                     local_1080.node_pool._M_t.
                     super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
                     .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl,&local_1098
                    );
          dxil_spv::SPIRVModule::set_entry_build_point(&local_1098,pFVar13->func);
          dxil_spv::CFGStructurizer::run((CFGStructurizer *)local_1038);
          dxil_spv::SPIRVModule::emit_leaf_function_body
                    (&local_1098,pFVar13->func,(CFGStructurizer *)local_1038);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(local_f40);
          if (local_f58 != (pointer)0x0) {
            dxil_spv::free_in_thread(local_f58);
          }
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_f90);
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)(auStack_1028 + 0x60));
          if ((pointer)auStack_1028._64_8_ != (pointer)0x0) {
            dxil_spv::free_in_thread((void *)auStack_1028._64_8_);
          }
          if ((pointer)auStack_1028._40_8_ != (pointer)0x0) {
            dxil_spv::free_in_thread((void *)auStack_1028._40_8_);
          }
          if ((pointer)auStack_1028._16_8_ != (pointer)0x0) {
            dxil_spv::free_in_thread((void *)auStack_1028._16_8_);
          }
        }
        if (pCVar4 == (CFGNode *)0x0) goto LAB_0010c0ca;
        pFVar13 = pFVar13 + 1;
      } while (pFVar13 !=
               local_1080.leaf_functions.
               super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pdVar5 = local_1088;
    bVar6 = dxil_spv::SPIRVModule::finalize_spirv(&local_1098,&local_1088->spirv);
    if (bVar6) {
      __str = dxil_spv::Converter::get_compiled_entry_point_abi_cxx11_(&local_10a0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_assign
                (&pdVar5->compiled_entry_point,__str);
      bVar6 = dxil_spv::SPIRVModule::has_builtin_shader_input(&local_1098,BuiltInSubgroupSize);
      pdVar5->uses_subgroup_size = bVar6;
      dxil_spv::Converter::get_workgroup_dimensions
                (&local_10a0,pdVar5->workgroup_size,pdVar5->workgroup_size + 1,
                 pdVar5->workgroup_size + 2);
      dxil_spv::Converter::get_compute_wave_size_range
                (&local_10a0,&pdVar5->wave_size_min,&pdVar5->wave_size_max,
                 &pdVar5->wave_size_preferred);
      uVar7 = dxil_spv::Converter::get_compute_heuristic_max_wave_size(&local_10a0);
      pdVar5->heuristic_wave_size = uVar7;
      uVar7 = dxil_spv::Converter::get_patch_vertex_count(&local_10a0);
      pdVar5->patch_vertex_count = uVar7;
      dVar12 = DXIL_SPV_SUCCESS;
      bVar6 = dxil_spv::Converter::shader_requires_feature(&local_10a0,Native16BitOperations);
      pdVar5->shader_feature_used[0] = bVar6;
      dxil_spv::Converter::get_analysis_warnings_abi_cxx11_((String *)local_1038,&local_10a0);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (&pdVar5->analysis_warnings,(String *)local_1038);
      if ((CFGNode *)local_1038._0_8_ != (CFGNode *)auStack_1028) {
        dxil_spv::free_in_thread((void *)local_1038._0_8_);
      }
      goto LAB_0010c0cf;
    }
    p_Var8 = dxil_spv::get_thread_log_callback();
    if (p_Var8 != (LoggingCallback)0x0) {
      auStack_1028._0_4_ = 0x5320657a;
      auStack_1028[4] = 'P';
      auStack_1028._5_6_ = 0xa2e562d5249;
      auStack_1028[0xb] = '\0';
      local_1038[8] = 'o';
      local_1038[9] = ' ';
      local_1038[10] = 'f';
      local_1038[0xb] = 'i';
      local_1038[0xc] = 'n';
      local_1038[0xd] = 'a';
      local_1038[0xe] = 'l';
      local_1038[0xf] = 'i';
      goto LAB_0010c0b4;
    }
    dxil_spv_converter_run_cold_2();
  }
LAB_0010c0ca:
  dVar12 = DXIL_SPV_ERROR_GENERIC;
LAB_0010c0cf:
  if (local_1080.node_pool._M_t.
      super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t
      .super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
      super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>)0x0) {
    dxil_spv::CFGNodePool::~CFGNodePool
              ((CFGNodePool *)
               local_1080.node_pool._M_t.
               super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
               ._M_t.
               super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
               .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl);
    dxil_spv::free_in_thread
              ((void *)local_1080.node_pool._M_t.
                       super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>
                       .super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl);
  }
  local_1080.node_pool._M_t.
  super___uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>._M_t.
  super__Tuple_impl<0UL,_dxil_spv::CFGNodePool_*,_std::default_delete<dxil_spv::CFGNodePool>_>.
  super__Head_base<0UL,_dxil_spv::CFGNodePool_*,_false>._M_head_impl =
       (__uniq_ptr_data<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>,_true,_true>
        )(__uniq_ptr_impl<dxil_spv::CFGNodePool,_std::default_delete<dxil_spv::CFGNodePool>_>)0x0;
  if (local_1080.leaf_functions.
      super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    dxil_spv::free_in_thread
              (local_1080.leaf_functions.
               super__Vector_base<dxil_spv::ConvertedFunction::Function,_dxil_spv::ThreadLocalAllocator<dxil_spv::ConvertedFunction::Function>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  dxil_spv::Converter::~Converter(&local_10a0);
  dxil_spv::SPIRVModule::~SPIRVModule(&local_1098);
  return dVar12;
}

Assistant:

dxil_spv_result dxil_spv_converter_run(dxil_spv_converter converter)
{
	SPIRVModule module;
	Converter dxil_converter(converter->bc_parser, converter->bc_reflection_parser, module);

	if (!converter->entry_point.empty())
		dxil_converter.set_entry_point(converter->entry_point.c_str());
	dxil_converter.set_resource_remapping_interface(&converter->remapper);
	for (auto &opt : converter->options)
		dxil_converter.add_option(*opt);

	for (auto &local_param : converter->local_root_parameters)
	{
		switch (local_param.type)
		{
		case LocalRootParameterType::Constants:
			dxil_converter.add_local_root_constants(local_param.local_constants.register_space,
			                                        local_param.local_constants.register_index,
			                                        local_param.local_constants.num_words);
			break;

		case LocalRootParameterType::Descriptor:
			dxil_converter.add_local_root_descriptor(local_param.local_descriptor.resource_class,
			                                         local_param.local_descriptor.register_space,
			                                         local_param.local_descriptor.register_index);
			break;

		case LocalRootParameterType::Table:
			dxil_converter.add_local_root_descriptor_table(local_param.table_entries);
			break;
		}
	}

	auto entry_point = dxil_converter.convert_entry_point();

	if (entry_point.entry.entry == nullptr)
	{
		LOGE("Failed to convert function.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	{
		dxil_spv::CFGStructurizer structurizer(entry_point.entry.entry, *entry_point.node_pool, module);
		uint32_t driver_id, driver_version;
		if (dxil_converter.get_driver_version(driver_id, driver_version))
			structurizer.set_driver_version(driver_id, driver_version);
		module.set_entry_build_point(entry_point.entry.func);
		structurizer.run();
		module.emit_entry_point_function_body(structurizer);
	}

	for (auto &leaf : entry_point.leaf_functions)
	{
		if (!leaf.entry)
		{
			LOGE("Leaf function is nullptr!\n");
			return DXIL_SPV_ERROR_GENERIC;
		}
		dxil_spv::CFGStructurizer structurizer(leaf.entry, *entry_point.node_pool, module);
		module.set_entry_build_point(leaf.func);
		structurizer.run();
		module.emit_leaf_function_body(leaf.func, structurizer);
	}

	if (!module.finalize_spirv(converter->spirv))
	{
		LOGE("Failed to finalize SPIR-V.\n");
		return DXIL_SPV_ERROR_GENERIC;
	}

	converter->compiled_entry_point = dxil_converter.get_compiled_entry_point();
	converter->uses_subgroup_size = module.has_builtin_shader_input(spv::BuiltInSubgroupSize);
	dxil_converter.get_workgroup_dimensions(converter->workgroup_size[0],
	                                        converter->workgroup_size[1],
	                                        converter->workgroup_size[2]);
	dxil_converter.get_compute_wave_size_range(converter->wave_size_min, converter->wave_size_max, converter->wave_size_preferred);
	converter->heuristic_wave_size = dxil_converter.get_compute_heuristic_max_wave_size();
	converter->patch_vertex_count = dxil_converter.get_patch_vertex_count();
	for (int i = 0; i < int(ShaderFeature::Count); i++)
		converter->shader_feature_used[i] = dxil_converter.shader_requires_feature(ShaderFeature(i));
	converter->analysis_warnings = dxil_converter.get_analysis_warnings();

	return DXIL_SPV_SUCCESS;
}